

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

double __thiscall NEST::NESTcalc::PhotonEnergy(NESTcalc *this,bool s2Flag,bool state,double tempK)

{
  bool bVar1;
  RandomGen *pRVar2;
  double dVar3;
  double dVar4;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  pRVar2 = RandomGen::rndm();
  if (bVar1) {
    if (state) {
      dVar3 = (double)0x4023666666666666;
      dVar4 = 0.2;
    }
    else {
      dVar3 = 9.69;
      dVar4 = 0.22;
    }
    dVar3 = RandomGen::rand_zero_trunc_gauss(pRVar2,dVar3,dVar4);
    return dVar3;
  }
  if (state) {
    dVar3 = 175.0;
    dVar4 = 5.0;
  }
  else {
    dVar3 = 178.0;
    dVar4 = 5.9447983014862;
  }
  dVar3 = RandomGen::rand_zero_trunc_gauss(pRVar2,dVar3,dVar4);
  if (s2Flag) {
    pRVar2 = RandomGen::rndm();
    dVar3 = RandomGen::rand_zero_trunc_gauss
                      (pRVar2,*(double *)(&DAT_00115da0 + (ulong)(tempK < 200.0) * 8),5.0);
  }
  dVar4 = 0.0085;
  if (1.24 / dVar3 <= 0.0085) {
    dVar4 = 1.24 / dVar3;
  }
  return dVar4 * 1000.0;
}

Assistant:

double NESTcalc::PhotonEnergy(bool s2Flag, bool state, double tempK) {
  double wavelength, E_keV;  // wavelength is in nanometers

  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    // liquid Argon
    if (state) return RandomGen::rndm()->rand_zero_trunc_gauss(9.7, 0.2);
    return RandomGen::rndm()->rand_zero_trunc_gauss(9.69, 0.22);
  }

  if (!state)  // liquid or solid
    wavelength = RandomGen::rndm()->rand_zero_trunc_gauss(
        178., 14. / 2.355);  // taken from Jortner JchPh 42 '65
  else {                     // gas
    wavelength = RandomGen::rndm()->rand_zero_trunc_gauss(
        175., 5.);  // G4S1Light, probably Doke
  }
  if (s2Flag) {
    // S2 different from ordinary gas (or just measurement error?)
    if (tempK < 200.)  // cold gas
      wavelength = RandomGen::rndm()->rand_zero_trunc_gauss(
          179., 5.);  // source is G4S2Light.cc from the old NEST
    else {
      wavelength = RandomGen::rndm()->rand_zero_trunc_gauss(174., 5.);  // ditto
    }
  }

  E_keV = 1240e-3 / wavelength;  // h*c in keV-nm divided by lambda in nm
  if (E_keV > W_SCINT)
    E_keV = W_SCINT;  // don't go so high breaks G4. Gauss in lambda -> non-G in
  // E, high tail

  return E_keV * 1000.;  // convert from keV into eV. Eventually add full T, P
                         // dependence
}